

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O1

int xmlSaveFormatFileEnc(char *filename,xmlDocPtr cur,char *encoding,int format)

{
  int iVar1;
  xmlOutputBufferPtr buf;
  
  if (cur != (xmlDocPtr)0x0) {
    buf = xmlOutputBufferCreateFilename(filename,(xmlCharEncodingHandlerPtr)0x0,cur->compression);
    if (buf != (xmlOutputBufferPtr)0x0) {
      xmlDocDumpInternal(buf,cur,encoding,format);
      iVar1 = xmlOutputBufferClose(buf);
      return iVar1;
    }
  }
  return -1;
}

Assistant:

int
xmlSaveFormatFileEnc( const char * filename, xmlDocPtr cur,
			const char * encoding, int format ) {
    xmlOutputBufferPtr buf;

    if (cur == NULL)
	return(-1);

#ifdef LIBXML_ZLIB_ENABLED
    if (cur->compression < 0) cur->compression = xmlGetCompressMode();
#endif
    /*
     * save the content to a temp buffer.
     */
    buf = xmlOutputBufferCreateFilename(filename, NULL, cur->compression);
    if (buf == NULL) return(-1);

    xmlDocDumpInternal(buf, cur, encoding, format);

    return(xmlOutputBufferClose(buf));
}